

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O1

CURLcode cf_ssl_peer_key_add_hash(dynbuf *buf,char *name,curl_blob *blob)

{
  CURLcode CVar1;
  long lVar2;
  uchar hash [32];
  byte local_38 [32];
  
  if (blob->len != 0) {
    CVar1 = Curl_dyn_addf(buf,":%s-",name);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    CVar1 = Curl_sha256it(local_38,(uchar *)blob->data,blob->len);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    lVar2 = 0;
    do {
      CVar1 = Curl_dyn_addf(buf,"%02x",(ulong)local_38[lVar2]);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cf_ssl_peer_key_add_hash(struct dynbuf *buf,
                                          const char *name,
                                          struct curl_blob *blob)
{
  CURLcode r = CURLE_OK;
  if(blob && blob->len) {
    unsigned char hash[CURL_SHA256_DIGEST_LENGTH];
    size_t i;

    r = Curl_dyn_addf(buf, ":%s-", name);
    if(r)
      goto out;
    r = Curl_sha256it(hash, blob->data, blob->len);
    if(r)
      goto out;
    for(i = 0; i < CURL_SHA256_DIGEST_LENGTH; ++i) {
      r = Curl_dyn_addf(buf, "%02x", hash[i]);
      if(r)
        goto out;
    }
  }
out:
  return r;
}